

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O2

void __thiscall
program_options::error_with_option_name::set_option_name
          (error_with_option_name *this,string *option_name)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"option",&local_39);
  set_substitute(this,&local_38,option_name);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

virtual void set_option_name(const std::string& option_name)
    {           set_substitute("option", option_name);}